

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::AddToPropertyList
          (JSONStringifier *this,Var item,BVSparse<Memory::Recycler> *propertyBV)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BOOL BVar4;
  BVIndex i;
  undefined4 *puVar5;
  RecyclableObject *this_00;
  undefined1 local_58 [8];
  PropertyListElement elem;
  PropertyRecord *propertyRecord;
  JavascriptString *propertyName;
  BVSparse<Memory::Recycler> *propertyBV_local;
  Var item_local;
  JSONStringifier *this_local;
  TypeId local_18;
  TypeId typeId;
  
  propertyRecord = (PropertyRecord *)0x0;
  if (item == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(item);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(item);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(item);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this_00);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(this_00), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  if (local_18 == TypeIds_FirstNumberType) {
    propertyRecord = (PropertyRecord *)ScriptContext::GetIntegerString(this->scriptContext,item);
    goto LAB_010b98e2;
  }
  if (2 < local_18 - TypeIds_Number) {
    if (local_18 == TypeIds_String) {
      propertyRecord = (PropertyRecord *)UnsafeVarTo<Js::JavascriptString>(item);
      goto LAB_010b98e2;
    }
    if (1 < local_18 - TypeIds_NumberObject) goto LAB_010b98e2;
  }
  propertyRecord = (PropertyRecord *)JavascriptConversion::ToString(item,this->scriptContext);
LAB_010b98e2:
  if (propertyRecord != (PropertyRecord *)0x0) {
    ScriptContext::GetOrAddPropertyRecord
              (this->scriptContext,(JavascriptString *)propertyRecord,
               (PropertyRecord **)&elem.propertyName);
    i = PropertyRecord::GetPropertyId((PropertyRecord *)elem.propertyName.ptr);
    BVar3 = BVSparse<Memory::Recycler>::TestAndSet(propertyBV,i);
    if (BVar3 == '\0') {
      PropertyListElement::PropertyListElement((PropertyListElement *)local_58);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                ((WriteBarrierPtr<Js::JavascriptString> *)&elem,(JavascriptString *)propertyRecord);
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
                ((WriteBarrierPtr<const_Js::PropertyRecord> *)local_58,
                 (PropertyRecord *)elem.propertyName.ptr);
      SList<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::Push
                (this->propertyList,(PropertyListElement *)local_58);
    }
  }
  return;
}

Assistant:

void
JSONStringifier::AddToPropertyList(_In_ Var item, _Inout_ BVSparse<Recycler>* propertyBV)
{
    JavascriptString* propertyName = nullptr;
    switch (JavascriptOperators::GetTypeId(item))
    {
    case TypeIds_Integer:
        propertyName = this->scriptContext->GetIntegerString(item);
        break;
    case TypeIds_String:
        propertyName = UnsafeVarTo<JavascriptString>(item);
        break;
    case TypeIds_Number:
    case TypeIds_NumberObject:
    case TypeIds_Int64Number:
    case TypeIds_UInt64Number:
    case TypeIds_StringObject:
        propertyName = JavascriptConversion::ToString(item, this->scriptContext);
        break;
    default:
        break;
    }

    if (propertyName != nullptr)
    {
        PropertyRecord const* propertyRecord;
        scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
        if(!propertyBV->TestAndSet(propertyRecord->GetPropertyId()))
        {
            PropertyListElement elem;
            elem.propertyName = propertyName;
            elem.propertyRecord = propertyRecord;
            this->propertyList->Push(elem);
        }
    }
}